

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O1

bool __thiscall
OpenMD::ifstrstream::internalOpen(ifstrstream *this,char *filename,openmode mode,bool param_3)

{
  long lVar1;
  
  lVar1 = std::filebuf::open(&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78,
                             (_Ios_Openmode)filename);
  std::ios::clear((int)this +
                  (int)(this->super_basic_istream<char,_std::char_traits<char>_>).
                       _vptr_basic_istream[-3]);
  return lVar1 != 0;
}

Assistant:

bool ifstrstream::internalOpen(const char* filename,
                                 std::ios_base::openmode mode, bool) {
    // in single version, fall back to ifstream
    if (!internalFileBuf_.open(filename, mode)) {
      this->setstate(std::ios_base::failbit);
      return false;
    }

    this->clear();
    return true;
  }